

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O2

void __thiscall DBaseDecal::CalcFracPos(DBaseDecal *this,side_t *wall,double x,double y)

{
  line_t_conflict *plVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  
  plVar1 = wall->linedef;
  bVar4 = plVar1->sidedef[0] == wall;
  dVar2 = **(double **)(plVar1->args + (ulong)!bVar4 * 2 + -0xb);
  dVar3 = (*(double **)(plVar1->args + (ulong)!bVar4 * 2 + -0xb))[1];
  dVar5 = **(double **)(plVar1->args + (ulong)bVar4 * 2 + -0xb) - dVar2;
  dVar6 = (*(double **)(plVar1->args + (ulong)bVar4 * 2 + -0xb))[1] - dVar3;
  if (ABS(dVar5) <= ABS(dVar6)) {
    dVar5 = 0.0;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      dVar5 = (y - dVar3) / dVar6;
    }
  }
  else {
    dVar5 = (x - dVar2) / dVar5;
  }
  this->LeftDistance = dVar5;
  return;
}

Assistant:

void DBaseDecal::CalcFracPos (side_t *wall, double x, double y)
{
	line_t *line = wall->linedef;
	vertex_t *v1, *v2;

	if (line->sidedef[0] == wall)
	{
		v1 = line->v1;
		v2 = line->v2;
	}
	else
	{
		v1 = line->v2;
		v2 = line->v1;
	}

	double dx = v2->fX() - v1->fX();
	double dy = v2->fY() - v1->fY();

	if (fabs(dx) > fabs(dy))
	{
		LeftDistance = (x - v1->fX()) / dx;
	}
	else if (dy != 0)
	{
		LeftDistance = (y - v1->fY()) / dy;
	}
	else
	{
		LeftDistance = 0;
	}
}